

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fIntegerStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::anon_unknown_2::FrontFaceTestCase::test(FrontFaceTestCase *this)

{
  int local_1c;
  GLenum GStack_18;
  int ndx;
  GLenum frontFaces [2];
  FrontFaceTestCase *this_local;
  
  frontFaces = (GLenum  [2])this;
  (*this->m_verifier->_vptr_StateVerifier[2])
            (this->m_verifier,
             (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,0xb46,
             0x901);
  ApiCase::expectError(&this->super_ApiCase,0);
  _GStack_18 = 0x90100000900;
  for (local_1c = 0; local_1c < 2; local_1c = local_1c + 1) {
    glu::CallLogWrapper::glFrontFace
              (&(this->super_ApiCase).super_CallLogWrapper,(&GStack_18)[local_1c]);
    ApiCase::expectError(&this->super_ApiCase,0);
    (*this->m_verifier->_vptr_StateVerifier[2])
              (this->m_verifier,
               (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,0xb46,
               (ulong)(&GStack_18)[local_1c]);
    ApiCase::expectError(&this->super_ApiCase,0);
  }
  return;
}

Assistant:

void test (void)
	{
		m_verifier->verifyInteger(m_testCtx, GL_FRONT_FACE, GL_CCW);
		expectError(GL_NO_ERROR);

		const GLenum frontFaces[] = {GL_CW, GL_CCW};
		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(frontFaces); ndx++)
		{
			glFrontFace(frontFaces[ndx]);
			expectError(GL_NO_ERROR);

			m_verifier->verifyInteger(m_testCtx, GL_FRONT_FACE, frontFaces[ndx]);
			expectError(GL_NO_ERROR);
		}
	}